

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O3

bool __thiscall libcellml::Component::removeReset(Component *this,size_t index)

{
  EntityImpl *pEVar1;
  size_type sVar2;
  ResetImpl *this_00;
  ulong uVar3;
  
  pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
  sVar2 = pEVar1[5].mId.field_2._M_allocated_capacity;
  uVar3 = (long)(*(long *)((long)&pEVar1[5].mId.field_2 + 8) - sVar2) >> 4;
  if (index < uVar3) {
    this_00 = Reset::pFunc(*(Reset **)(sVar2 + index * 0x10));
    ParentedEntity::ParentedEntityImpl::removeParent(&this_00->super_ParentedEntityImpl);
    pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             mPimpl;
    std::
    vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>::
    _M_erase((vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
              *)&pEVar1[5].mId.field_2,
             (shared_ptr<libcellml::Reset> *)
             (index * 0x10 + pEVar1[5].mId.field_2._M_allocated_capacity));
  }
  return index < uVar3;
}

Assistant:

bool Component::removeReset(size_t index)
{
    if (index < pFunc()->mResets.size()) {
        pFunc()->mResets.at(index)->pFunc()->removeParent();
        pFunc()->mResets.erase(pFunc()->mResets.begin() + ptrdiff_t(index));
        return true;
    }
    return false;
}